

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O1

void __thiscall Assimp::IrrlichtBase::ReadIntProperty(IrrlichtBase *this,IntProperty *out)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  char *pcVar4;
  undefined4 extraout_var_02;
  char cVar5;
  uint uVar6;
  bool bVar7;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  undefined4 extraout_var_01;
  
  iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
  if (0 < iVar1) {
    uVar6 = 0;
    do {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar6);
      if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
LAB_003e3b7b:
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                      ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar1 = strcasecmp((char *)CONCAT44(extraout_var,iVar1),"name");
      if (iVar1 == 0) {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,(char *)CONCAT44(extraout_var_02,iVar1),&local_51);
        std::__cxx11::string::operator=((string *)out,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      else {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar6);
        if ((char *)CONCAT44(extraout_var_00,iVar1) == (char *)0x0) goto LAB_003e3b7b;
        iVar1 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar1),"value");
        if (iVar1 == 0) {
          iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])();
          pcVar3 = (char *)CONCAT44(extraout_var_01,iVar1);
          bVar7 = (*pcVar3 - 0x2bU & 0xfd) == 0;
          cVar5 = pcVar3[bVar7];
          iVar1 = 0;
          if (0xf5 < (byte)(cVar5 - 0x3aU)) {
            pcVar4 = pcVar3 + bVar7;
            iVar1 = 0;
            do {
              pcVar4 = pcVar4 + 1;
              iVar1 = (uint)(byte)(cVar5 - 0x30) + iVar1 * 10;
              cVar5 = *pcVar4;
            } while (0xf5 < (byte)(cVar5 - 0x3aU));
          }
          iVar2 = -iVar1;
          if (*pcVar3 != '-') {
            iVar2 = iVar1;
          }
          out->value = iVar2;
        }
      }
      uVar6 = uVar6 + 1;
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
    } while ((int)uVar6 < iVar1);
  }
  return;
}

Assistant:

void IrrlichtBase::ReadIntProperty    (IntProperty&    out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // parse the ecimal value
            out.value = strtol10(reader->getAttributeValue(i));
        }
    }
}